

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70a26::PedestrianPlugIn::printMiniHelpForFunctionKeys(PedestrianPlugIn *this)

{
  ostream *poVar1;
  char *pcVar2;
  long *in_RDI;
  ostringstream message;
  ostringstream *in_stack_fffffffffffffe70;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::operator<<((ostream *)local_180,"Function keys handled by ");
  poVar1 = std::operator<<((ostream *)local_180,'\"');
  pcVar2 = (char *)(**(code **)(*in_RDI + 0x38))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,'\"');
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,std::ends<char,std::char_traits<char>>);
  OpenSteer::OpenSteerDemo::printMessage(in_stack_fffffffffffffe70);
  OpenSteer::OpenSteerDemo::printMessage(in_stack_fffffffffffffe70);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x152880);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x15288e);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x15289c);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x1528aa);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x1528b8);
  OpenSteer::OpenSteerDemo::printMessage((char *)0x1528c6);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void printMiniHelpForFunctionKeys (void)
        {
            std::ostringstream message;
            message << "Function keys handled by ";
            message << '"' << name() << '"' << ':' << std::ends;
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage ("  F1     add a pedestrian to the crowd.");
            OpenSteerDemo::printMessage ("  F2     remove a pedestrian from crowd.");
            OpenSteerDemo::printMessage ("  F3     use next proximity database.");
            OpenSteerDemo::printMessage ("  F4     toggle directed path follow.");
            OpenSteerDemo::printMessage ("  F5     toggle wander component on/off.");
            OpenSteerDemo::printMessage ("");
        }